

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O1

void BrotliSplitBlockCommandsFromStored
               (MemoryManager *m,Command *cmds,size_t num_commands,size_t pos,size_t mask,
               BlockSplit *cmd_split,BlockSplitFromDecoder *cmd_split_decoder,
               size_t *cur_block_decoder)

{
  size_t __size;
  uint uVar1;
  ulong uVar2;
  uint8_t *__dest;
  uint32_t *__dest_00;
  void *__s;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  byte bVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  
  uVar3 = cmd_split->types_alloc_size;
  uVar2 = cmd_split_decoder->num_blocks;
  if (uVar3 < uVar2) {
    if (uVar3 == 0) {
      uVar3 = uVar2;
    }
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 * 2;
    } while (uVar4 < uVar2);
    if (uVar4 == 0) {
      __dest = (uint8_t *)0x0;
    }
    else {
      __dest = (uint8_t *)BrotliAllocate(m,uVar4);
    }
    if (cmd_split->types_alloc_size != 0) {
      memcpy(__dest,cmd_split->types,cmd_split->types_alloc_size);
    }
    BrotliFree(m,cmd_split->types);
    cmd_split->types = __dest;
    cmd_split->types_alloc_size = uVar4;
  }
  uVar3 = cmd_split->lengths_alloc_size;
  uVar2 = cmd_split_decoder->num_blocks;
  if (uVar3 < uVar2) {
    if (uVar3 == 0) {
      uVar3 = uVar2;
    }
    do {
      uVar4 = uVar3;
      uVar3 = uVar4 * 2;
    } while (uVar4 < uVar2);
    if (uVar4 == 0) {
      __dest_00 = (uint32_t *)0x0;
    }
    else {
      __dest_00 = (uint32_t *)BrotliAllocate(m,uVar4 * 4);
    }
    if (cmd_split->lengths_alloc_size != 0) {
      memcpy(__dest_00,cmd_split->lengths,cmd_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,cmd_split->lengths);
    cmd_split->lengths = __dest_00;
    cmd_split->lengths_alloc_size = uVar4;
  }
  cmd_split->num_types = 0;
  cmd_split->num_blocks = 0;
  sVar5 = cmd_split_decoder->num_types;
  __size = sVar5 * 4;
  __s = malloc(__size);
  if (sVar5 != 0) {
    memset(__s,0xff,__size);
  }
  if (num_commands == 0) {
    lVar7 = 0;
  }
  else {
    sVar5 = 0;
    lVar7 = 0;
    do {
      if ((cmd_split_decoder->positions_end[*cur_block_decoder] <= pos) && (lVar7 != 0)) {
        uVar3 = (ulong)cmd_split_decoder->types[*cur_block_decoder];
        if (*(int *)((long)__s + uVar3 * 4) == -1) {
          *(int *)((long)__s + uVar3 * 4) = (int)cmd_split->num_types;
        }
        sVar8 = cmd_split->num_blocks;
        if ((sVar8 == 0) || (*(uint *)((long)__s + uVar3 * 4) != (uint)cmd_split->types[sVar8 - 1]))
        {
          cmd_split->types[sVar8] = *(uint8_t *)((long)__s + uVar3 * 4);
          sVar8 = cmd_split->num_blocks;
          cmd_split->lengths[sVar8] = (uint32_t)lVar7;
          uVar1 = (uint)cmd_split->num_types;
          bVar6 = cmd_split->types[sVar8] + 1;
          uVar9 = (uint)bVar6;
          if (bVar6 < (byte)uVar1) {
            uVar9 = uVar1;
          }
          cmd_split->num_types = (ulong)(uVar9 & 0xff);
          cmd_split->num_blocks = sVar8 + 1;
        }
        else {
          cmd_split->lengths[sVar8 - 1] = cmd_split->lengths[sVar8 - 1] + (uint32_t)lVar7;
        }
        *cur_block_decoder = *cur_block_decoder + 1;
        lVar7 = 0;
      }
      sVar8 = *cur_block_decoder;
      if (cmd_split_decoder->positions_end[sVar8] <= pos) {
        do {
          lVar7 = sVar8 + 1;
          sVar8 = sVar8 + 1;
        } while (cmd_split_decoder->positions_end[lVar7] <= pos);
        *cur_block_decoder = sVar8;
        lVar7 = 0;
      }
      lVar7 = (lVar7 + 1) - (ulong)(pos < cmd_split_decoder->positions_begin[sVar8]);
      pos = pos + ((cmds[sVar5].copy_len_ & 0x1ffffff) + cmds[sVar5].insert_len_);
      sVar5 = sVar5 + 1;
    } while (sVar5 != num_commands);
  }
  if (lVar7 != 0) {
    uVar3 = (ulong)cmd_split_decoder->types[*cur_block_decoder];
    if (*(int *)((long)__s + uVar3 * 4) == -1) {
      *(int *)((long)__s + uVar3 * 4) = (int)cmd_split->num_types;
    }
    sVar5 = cmd_split->num_blocks;
    if ((sVar5 == 0) || (*(uint *)((long)__s + uVar3 * 4) != (uint)cmd_split->types[sVar5 - 1])) {
      cmd_split->types[sVar5] = *(uint8_t *)((long)__s + uVar3 * 4);
      sVar5 = cmd_split->num_blocks;
      cmd_split->lengths[sVar5] = (uint32_t)lVar7;
      uVar1 = (uint)cmd_split->num_types;
      bVar6 = cmd_split->types[sVar5] + 1;
      uVar9 = (uint)bVar6;
      if (bVar6 < (byte)uVar1) {
        uVar9 = uVar1;
      }
      cmd_split->num_types = (ulong)(uVar9 & 0xff);
      cmd_split->num_blocks = sVar5 + 1;
    }
    else {
      cmd_split->lengths[sVar5 - 1] = cmd_split->lengths[sVar5 - 1] + (uint32_t)lVar7;
    }
  }
  return;
}

Assistant:

void BrotliSplitBlockCommandsFromStored(
                        MemoryManager* m,
                        const Command* cmds,
                        const size_t num_commands,
                        const size_t pos,
                        const size_t mask,
                        BlockSplit* cmd_split,
                        const BlockSplitFromDecoder* cmd_split_decoder,
                        size_t* cur_block_decoder) {
    BROTLI_ENSURE_CAPACITY(
        m, uint8_t, cmd_split->types, cmd_split->types_alloc_size,
        cmd_split_decoder->num_blocks);
    BROTLI_ENSURE_CAPACITY(
        m, uint32_t, cmd_split->lengths, cmd_split->lengths_alloc_size,
        cmd_split_decoder->num_blocks);
    size_t cur_pos = pos;
    cmd_split->num_blocks = 0;
    cmd_split->num_types = 0;
    size_t cur_length = 0;
    /* Mapping of the types from decoder (they increase with each metablock)
       to the appropriate types */
    int* types_mapping = (int*)malloc(sizeof(int) * cmd_split_decoder->num_types);
    for (int i = 0; i < cmd_split_decoder->num_types; ++i) {
      types_mapping[i] = -1;
    }
    for (int i = 0; i < num_commands; ++i) {
      const Command cmd = cmds[i];
      /* If current command lies after the current block
         that means we've finished the current block.
         If some commands have fallen inside current block before
         then need to save it*/
      if (cur_pos >= cmd_split_decoder->positions_end[*cur_block_decoder] &&
            cur_length > 0) {
        /* If we haven't seen this decoder block type before
          then save a mapping of it to a current num_types */
        if (types_mapping[cmd_split_decoder->types[*cur_block_decoder]] == -1) {
          types_mapping[cmd_split_decoder->types[*cur_block_decoder]] =
                                                          cmd_split->num_types;
        }
        /* If the same block type as for a previous block then merge them */
        if (cmd_split->num_blocks > 0 &&
            types_mapping[cmd_split_decoder->types[*cur_block_decoder]] ==
              cmd_split->types[cmd_split->num_blocks - 1]) {
            cmd_split->lengths[cmd_split->num_blocks - 1] += cur_length;
        } else {
          /* Map the decoder block type to an appropriate type */
          cmd_split->types[cmd_split->num_blocks] =
                    types_mapping[cmd_split_decoder->types[*cur_block_decoder]];
          cmd_split->lengths[cmd_split->num_blocks] = cur_length;
          cmd_split->num_types = BROTLI_MAX(uint8_t, cmd_split->num_types,
                                  cmd_split->types[cmd_split->num_blocks] + 1);
          cmd_split->num_blocks++;
        }
        cur_length = 0;
        (*cur_block_decoder)++;
      }
      /* Go through decoder blocks until a block with cur_pos inside is found */
      while (cur_pos >= cmd_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length = 0;
        (*cur_block_decoder)++;
      }
      /* If command lies inside current block then
         increase an amount of commands inside current block*/
      if (cur_pos >= cmd_split_decoder->positions_begin[*cur_block_decoder] &&
          cur_pos < cmd_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length++;
      } else {
        // TODO: log that back refs are wrong
      }
      /* Shift cur_pos by the amount of symbols representing a command */
      cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
    }
    /* Save the last in metablock block */
    if (cur_length > 0) {
      if (types_mapping[cmd_split_decoder->types[*cur_block_decoder]] == -1) {
        types_mapping[cmd_split_decoder->types[*cur_block_decoder]] =
                                                            cmd_split->num_types;
      }
      /* If the same block type as for a previous block then merge them */
      if (cmd_split->num_blocks > 0 &&
          types_mapping[cmd_split_decoder->types[*cur_block_decoder]] ==
            cmd_split->types[cmd_split->num_blocks - 1]) {
          cmd_split->lengths[cmd_split->num_blocks - 1] += cur_length;
      } else {
        cmd_split->types[cmd_split->num_blocks] =
                      types_mapping[cmd_split_decoder->types[*cur_block_decoder]];
        cmd_split->lengths[cmd_split->num_blocks] = cur_length;
        cmd_split->num_types = BROTLI_MAX(uint8_t, cmd_split->num_types,
                                      cmd_split->types[cmd_split->num_blocks] + 1);
        cmd_split->num_blocks++;
      }
    }
}